

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

uuid * __thiscall pstore::uuid::str_abi_cxx11_(uuid *this)

{
  anon_class_16_2_f1c5b3f1 __f;
  const_iterator __first;
  const_iterator __last;
  long lVar1;
  array<unsigned_char,_16UL> *in_RSI;
  uint local_30 [2];
  uint index;
  undefined1 local_19;
  uuid *this_local;
  string *resl;
  
  local_19 = 0;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::reserve((ulong)this);
  local_30[0] = 0;
  __first = std::begin<std::array<unsigned_char,16ul>>(in_RSI);
  __last = std::end<std::array<unsigned_char,16ul>>(in_RSI);
  __f.resl = (string *)this;
  __f.index = local_30;
  std::for_each<unsigned_char_const*,pstore::uuid::str[abi:cxx11]()const::__0>(__first,__last,__f);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0x24) {
    assert_failed("resl.length () == string_length",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/uuid.cpp"
                  ,0xe5);
  }
  return this;
}

Assistant:

std::string uuid::str () const {
        std::string resl;
        resl.reserve (string_length);
        auto index = 0U;
        std::for_each (std::begin (data_), std::end (data_), [&] (unsigned const c) {
            if (index == 4 || index == 6 || index == 8 || index == 10) {
                resl += '-';
            }
            ++index;
            resl += digit_to_hex ((c >> 4) & 0x0F);
            resl += digit_to_hex (c & 0x0F);
        });
        PSTORE_ASSERT (resl.length () == string_length);
        return resl;
    }